

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Miscellaneous.cpp
# Opt level: O0

void __thiscall chatra::WaitContext::restoreReferences(WaitContext *this,Reader *r)

{
  value_type *pvVar1;
  reference this_00;
  pointer pTVar2;
  Reference ref;
  EventObject *pEVar3;
  value_type *t;
  size_t i;
  Reader *local_18;
  Reader *r_local;
  WaitContext *this_local;
  
  local_18 = r;
  r_local = (Reader *)this;
  i = (size_t)Reader::readReference(r);
  Reference::operator=(&this->self,(Reference *)&i);
  t = (value_type *)0x0;
  while( true ) {
    pvVar1 = (value_type *)
             std::
             vector<std::unique_ptr<chatra::WaitContext::Target,_std::default_delete<chatra::WaitContext::Target>_>,_std::allocator<std::unique_ptr<chatra::WaitContext::Target,_std::default_delete<chatra::WaitContext::Target>_>_>_>
             ::size(&this->targets);
    if (pvVar1 <= t) break;
    this_00 = std::
              vector<std::unique_ptr<chatra::WaitContext::Target,_std::default_delete<chatra::WaitContext::Target>_>,_std::allocator<std::unique_ptr<chatra::WaitContext::Target,_std::default_delete<chatra::WaitContext::Target>_>_>_>
              ::operator[](&this->targets,(size_type)t);
    pTVar2 = std::
             unique_ptr<chatra::WaitContext::Target,_std::default_delete<chatra::WaitContext::Target>_>
             ::operator->(this_00);
    pTVar2->ct = this;
    ref = Object::ref(&this->super_Object,(size_t)t);
    pEVar3 = derefAsEventObject(ref);
    pTVar2 = std::
             unique_ptr<chatra::WaitContext::Target,_std::default_delete<chatra::WaitContext::Target>_>
             ::operator->(this_00);
    pTVar2->eventObject = pEVar3;
    pTVar2 = std::
             unique_ptr<chatra::WaitContext::Target,_std::default_delete<chatra::WaitContext::Target>_>
             ::operator->(this_00);
    pEVar3 = pTVar2->eventObject;
    pTVar2 = std::
             unique_ptr<chatra::WaitContext::Target,_std::default_delete<chatra::WaitContext::Target>_>
             ::get(this_00);
    EventObject::registerWatcher(pEVar3,pTVar2,WaitContextEventWatcher);
    pTVar2 = std::
             unique_ptr<chatra::WaitContext::Target,_std::default_delete<chatra::WaitContext::Target>_>
             ::operator->(this_00);
    pEVar3 = pTVar2->eventObject;
    pTVar2 = std::
             unique_ptr<chatra::WaitContext::Target,_std::default_delete<chatra::WaitContext::Target>_>
             ::get(this_00);
    EventObject::activateWatcher(pEVar3,pTVar2);
    t = (value_type *)
        ((long)&(t->_M_t).
                super___uniq_ptr_impl<chatra::WaitContext::Target,_std::default_delete<chatra::WaitContext::Target>_>
                ._M_t.
                super__Tuple_impl<0UL,_chatra::WaitContext::Target_*,_std::default_delete<chatra::WaitContext::Target>_>
                .super__Head_base<0UL,_chatra::WaitContext::Target_*,_false>._M_head_impl + 1);
  }
  return;
}

Assistant:

void WaitContext::restoreReferences(Reader& r) {
	self = r.readReference();

	for (size_t i = 0; i < targets.size(); i++) {
		auto& t = targets[i];
		t->ct = this;
		t->eventObject = derefAsEventObject(ref(i));
		t->eventObject->registerWatcher(t.get(), WaitContextEventWatcher);
		t->eventObject->activateWatcher(t.get());
	}
}